

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

int32_t __thiscall helics::CommonCore::getFederationSize(CommonCore *this)

{
  BrokerState BVar1;
  size_type sVar2;
  long in_RDI;
  shared_guarded<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
  *in_stack_ffffffffffffffa8;
  lock_handle<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
  local_28;
  int32_t local_4;
  
  BVar1 = BrokerBase::getBrokerState((BrokerBase *)0x46afdc);
  if (BVar1 < OPERATING) {
    gmlc::libguarded::
    shared_guarded<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
    ::lock(in_stack_ffffffffffffffa8);
    gmlc::libguarded::
    lock_handle<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
    ::operator->(&local_28);
    sVar2 = gmlc::containers::
            MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::size((MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x46b020);
    local_4 = (int32_t)sVar2;
    gmlc::libguarded::
    lock_handle<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
    ::~lock_handle((lock_handle<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
                    *)0x46b03a);
  }
  else {
    local_4 = *(int32_t *)(in_RDI + 0x3e0);
  }
  return local_4;
}

Assistant:

int32_t CommonCore::getFederationSize()
{
    if (getBrokerState() >= BrokerState::OPERATING) {
        return mGlobalFederationSize;
    }
    // if we are in initialization return the local federation size
    return static_cast<int32_t>(federates.lock()->size());
}